

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::ParserBase::parse
          (InternalParseResult *__return_storage_ptr__,ParserBase *this,Args *args)

{
  TokenStream local_68;
  string local_40;
  Args *local_20;
  Args *args_local;
  ParserBase *this_local;
  
  local_20 = args;
  args_local = (Args *)this;
  this_local = (ParserBase *)__return_storage_ptr__;
  Args::exeName_abi_cxx11_(&local_40,args);
  TokenStream::TokenStream(&local_68,local_20);
  (*this->_vptr_ParserBase[3])(__return_storage_ptr__,this,&local_40,&local_68);
  TokenStream::~TokenStream(&local_68);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

auto parse( Args const &args ) const -> InternalParseResult {
            return parse( args.exeName(), TokenStream( args ) );
        }